

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O3

bool __thiscall
ON_AerialPhotoCameraPosition::SetOrientationVectors
          (ON_AerialPhotoCameraPosition *this,ON_3dVector camera_up,ON_3dVector camera_right,
          ON_3dVector camera_direction)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  ON_3dVector *pOVar8;
  double *pdVar9;
  byte bVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ON_3dVector Y;
  ON_3dVector Z;
  ON_3dVector X;
  ON_Xform in_stack_fffffffffffffe58;
  ON_3dVector local_128;
  ON_3dVector local_108;
  ON_3dVector local_e8;
  double local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  ON_3dVector local_b0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar10 = 0;
  local_e8.z = camera_right.z;
  local_e8.x = camera_right.x;
  local_e8.y = camera_right.y;
  local_128.z = camera_up.z;
  local_128.x = camera_up.x;
  local_128.y = camera_up.y;
  ON_3dVector::operator-(&local_108,&camera_direction);
  bVar4 = ON_3dVector::IsValid(&local_e8);
  if (bVar4) {
    bVar4 = ON_3dVector::Unitize(&local_e8);
  }
  else {
    bVar4 = false;
  }
  bVar5 = ON_3dVector::IsValid(&local_128);
  if (bVar5) {
    bVar5 = ON_3dVector::Unitize(&local_128);
  }
  else {
    bVar5 = false;
  }
  bVar6 = ON_3dVector::IsValid(&local_108);
  if (bVar6) {
    bVar6 = ON_3dVector::Unitize(&local_108);
    if ((bVar5 & bVar6) == 1 && bVar4 == false) {
      ON_CrossProduct(&local_b0,&local_128,&local_108);
      local_e8.z = local_b0.z;
      local_e8.x = local_b0.x;
      local_e8.y = local_b0.y;
      bVar4 = ON_3dVector::Unitize(&local_e8);
      if (!bVar4) goto LAB_00566c2d;
      camera_right.z = local_e8.z;
      camera_right.x = local_e8.x;
      camera_right.y = local_e8.y;
      bVar4 = true;
    }
    else {
      if ((bVar6 & bVar4) != 1 || bVar5 != false) goto LAB_00566938;
      ON_CrossProduct(&local_b0,&local_108,&local_e8);
      local_128.z = local_b0.z;
      local_128.x = local_b0.x;
      local_128.y = local_b0.y;
      bVar5 = ON_3dVector::Unitize(&local_128);
      if (!bVar5) goto LAB_00566c2d;
      camera_up.z = local_128.z;
      camera_up.x = local_128.x;
      camera_up.y = local_128.y;
      bVar5 = true;
    }
  }
  else {
    bVar6 = false;
LAB_00566938:
    if ((bVar4 & bVar5) == 1 && bVar6 == false) {
      ON_CrossProduct(&local_b0,&local_e8,&local_128);
      local_108.z = local_b0.z;
      local_108.x = local_b0.x;
      local_108.y = local_b0.y;
      bVar6 = ON_3dVector::Unitize(&local_108);
      if (!bVar6) goto LAB_00566c2d;
      ON_3dVector::operator-(&local_b0,&local_108);
      camera_direction.z = local_b0.z;
      camera_direction.x = local_b0.x;
      camera_direction.y = local_b0.y;
      bVar6 = true;
    }
  }
  if ((bVar4 & bVar5 & bVar6) == 1) {
    dVar1 = ON_3dVector::operator*(&local_e8,&local_128);
    local_c8 = 0.0;
    if (dVar1 != 0.0) {
      local_c8 = ABS(dVar1);
    }
    dVar1 = ON_3dVector::operator*(&local_128,&local_108);
    uVar2 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) & 0x7fffffffffffffff;
    uStack_c0 = (undefined4)uVar2;
    uStack_bc = (undefined4)(uVar2 >> 0x20);
    dVar3 = ABS(dVar1);
    if (ABS(dVar1) <= local_c8) {
      dVar3 = local_c8;
    }
    local_c8 = dVar3;
    dVar1 = ON_3dVector::operator*(&local_108,&local_e8);
    dVar3 = ABS(dVar1);
    if (ABS(dVar1) <= local_c8) {
      dVar3 = local_c8;
    }
    if (dVar3 <= 1e-08) {
      ON_CrossProduct(&local_b0,&local_e8,&local_128);
      dVar1 = ON_3dVector::operator*(&local_108,&local_b0);
      if (0.0 < dVar1) {
        ON_Xform::ON_Xform((ON_Xform *)&local_b0);
        local_b0.x = local_e8.x;
        local_b0.y = local_128.x;
        local_b0.z = local_108.x;
        local_98 = 0;
        local_90 = local_e8.y;
        local_88 = local_128.y;
        local_80 = local_108.y;
        local_78 = 0;
        local_70 = local_e8.z;
        local_68 = local_128.z;
        local_60 = local_108.z;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_38 = 0x3ff0000000000000;
        pOVar8 = &local_b0;
        pdVar9 = (double *)&stack0xfffffffffffffe58;
        for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
          *pdVar9 = (*(double (*) [4])&pOVar8->x)[0];
          pOVar8 = (ON_3dVector *)((long)pOVar8 + ((ulong)bVar10 * -2 + 1) * 8);
          pdVar9 = pdVar9 + (ulong)bVar10 * -2 + 1;
        }
        SetOrientationRotation(this,in_stack_fffffffffffffe58);
        (this->m_orientation_right).z = camera_right.z;
        (this->m_orientation_right).x = camera_right.x;
        (this->m_orientation_right).y = camera_right.y;
        (this->m_orientation_up).x = camera_up.x;
        (this->m_orientation_up).y = camera_up.y;
        (this->m_orientation_up).z = camera_up.z;
        (this->m_orientation_direction).x = camera_direction.x;
        (this->m_orientation_direction).y = camera_direction.y;
        (this->m_orientation_direction).z = camera_direction.z;
        return true;
      }
    }
  }
LAB_00566c2d:
  UnsetOrientation(this);
  return false;
}

Assistant:

bool ON_AerialPhotoCameraPosition::SetOrientationVectors(
    ON_3dVector camera_up,
    ON_3dVector camera_right,
    ON_3dVector camera_direction
    )
{
  ON_3dVector X(camera_right);
  ON_3dVector Y(camera_up);
  ON_3dVector Z(-camera_direction);

  bool bHaveX = ( X.IsValid() && X.Unitize() );
  bool bHaveY = ( Y.IsValid() && Y.Unitize() );
  bool bHaveZ = ( Z.IsValid() && Z.Unitize() );
  
  if ( !bHaveX && bHaveY && bHaveZ )
  {
    X = ON_CrossProduct(Y,Z);
    bHaveX = X.Unitize();
    if ( bHaveX )
      camera_right = X;
  }
  else if ( !bHaveY && bHaveZ && bHaveX )
  {
    Y = ON_CrossProduct(Z,X);
    bHaveY = Y.Unitize();
    if ( bHaveY )
      camera_up = Y;
  }
  else if ( !bHaveZ && bHaveX && bHaveY )
  {
    Z = ON_CrossProduct(X,Y);
    bHaveZ = Z.Unitize();
    if ( bHaveZ )
      camera_direction = -Z;
  }

  bool rc = false;
  for (;;)
  {
    if ( !bHaveX || !bHaveY || !bHaveZ )
      break;

    double max_dot = 0.0;
    double d = fabs(X*Y);
    if ( d > max_dot )
      max_dot = d;
    d = fabs(Y*Z);
    if ( d > max_dot )
      max_dot = d;
    d = fabs(Z*X);
    if ( d > max_dot )
      max_dot = d;

    if ( max_dot > 1.0e-8 )
      break;

    d = Z*ON_CrossProduct(X,Y);
    if ( !(d > 0.0) )
      break;

    ON_Xform R;
    R.m_xform[0][0] = X.x; R.m_xform[0][1] = Y.x; R.m_xform[0][2] = Z.x; R.m_xform[0][3] = 0.0;
    R.m_xform[1][0] = X.y; R.m_xform[1][1] = Y.y; R.m_xform[1][2] = Z.y; R.m_xform[1][3] = 0.0;
    R.m_xform[2][0] = X.z; R.m_xform[2][1] = Y.z; R.m_xform[2][2] = Z.z; R.m_xform[2][3] = 0.0;
    R.m_xform[3][0] = 0.0; R.m_xform[3][1] = 0.0; R.m_xform[3][2] = 0.0; R.m_xform[3][3] = 1.0;

    rc = SetOrientationRotation(R);

    if (rc)
    {
      // preserve exact values of input parameters
      m_orientation_right = camera_right;
      m_orientation_up = camera_up;
      m_orientation_direction = camera_direction;
    }

    break;
  }

  if (!rc)
  {
    UnsetOrientation();
  }

  return rc;
}